

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitonicsort.hpp
# Opt level: O0

void mxx::impl::
     bitonic_split<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,comm *param_3,int param_4,int param_5)

{
  bool bVar1;
  int iVar2;
  pair<int,_int> *__n;
  reference ppVar3;
  MPI_Datatype poVar4;
  reference pvVar5;
  MPI_Datatype poVar6;
  MPI_Comm poVar7;
  reference ppVar8;
  iterator __first;
  iterator __last;
  pair<int,_int> *local_128;
  size_t i_1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_118;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_110;
  iterator o_1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_100;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_f8;
  iterator r_1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_e8;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  l_1;
  size_t i;
  iterator o;
  iterator r;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  l;
  datatype dt;
  undefined1 local_a0 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> merge_buf;
  allocator<std::pair<int,_int>_> local_71;
  undefined1 local_70 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> recv_buf;
  undefined4 local_48;
  size_t np;
  int dir_local;
  int partner_local;
  comm *comm_local;
  pair<int,_int> *local_28;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  end_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  begin_local;
  
  recv_buf.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = end._M_current;
  local_28 = end._M_current;
  end_local._M_current = begin._M_current;
  __n = (pair<int,_int> *)
        std::
        distance<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  (begin,end);
  std::allocator<std::pair<int,_int>_>::allocator(&local_71);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70,
             (size_type_conflict)__n,&local_71);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_71);
  std::allocator<std::pair<int,_int>_>::allocator((allocator<std::pair<int,_int>_> *)&dt.field_0x17)
  ;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_a0,
             (size_type_conflict)__n,(allocator_type *)&dt.field_0x17);
  std::allocator<std::pair<int,_int>_>::~allocator
            ((allocator<std::pair<int,_int>_> *)&dt.field_0x17);
  get_datatype<std::pair<int,int>>();
  ppVar3 = __gnu_cxx::
           __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           ::operator*(&end_local);
  local_48 = SUB84(__n,0);
  poVar4 = mxx::datatype::type((datatype *)&l);
  pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70
                      ,0);
  poVar6 = mxx::datatype::type((datatype *)&l);
  poVar7 = mxx::comm::operator_cast_to_ompi_communicator_t_(param_3);
  MPI_Sendrecv(ppVar3,(ulong)__n & 0xffffffff,poVar4,param_4,0,pvVar5,local_48,poVar6,param_4,0,
               poVar7,0);
  if (((param_5 == 0) && (iVar2 = mxx::comm::rank(param_3), iVar2 < param_4)) ||
     ((param_5 == 1 && (iVar2 = mxx::comm::rank(param_3), param_4 < iVar2)))) {
    r._M_current = end_local._M_current;
    o = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70);
    i = (size_t)std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           local_a0);
    for (l_1._M_current = (pair<int,_int> *)0x0; l_1._M_current < __n;
        l_1._M_current = (pair<int,_int> *)((long)&(l_1._M_current)->first + 1)) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&r);
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&o);
      bVar1 = MxxSort_StableSort_Test::TestBody::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&comm_local + 7),ppVar3,ppVar8);
      if (bVar1) {
        ppVar3 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&r);
        ppVar8 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)&i);
        std::pair<int,_int>::operator=(ppVar8,ppVar3);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)&i);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&r);
      }
      else {
        ppVar3 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&o);
        ppVar8 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)&i);
        std::pair<int,_int>::operator=(ppVar8,ppVar3);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)&i);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&o);
      }
    }
  }
  else {
    r_1._M_current =
         (pair<int,_int> *)
         __gnu_cxx::
         __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
         ::operator+(&end_local,(difference_type)__n);
    local_e8 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator-(&r_1,1);
    o_1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70)
    ;
    local_100 = __gnu_cxx::
                __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                ::operator+(&o_1,(difference_type)__n);
    local_f8 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator-(&local_100,1);
    i_1 = (size_t)std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             local_a0);
    local_118 = __gnu_cxx::
                __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                             *)&i_1,(difference_type)__n);
    local_110 = __gnu_cxx::
                __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                ::operator-(&local_118,1);
    for (local_128 = (pair<int,_int> *)0x0; local_128 < __n;
        local_128 = (pair<int,_int> *)((long)&local_128->first + 1)) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&local_e8);
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&local_f8);
      bVar1 = MxxSort_StableSort_Test::TestBody::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&comm_local + 7),ppVar3,ppVar8);
      if (bVar1) {
        ppVar3 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&local_f8);
        ppVar8 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&local_110);
        std::pair<int,_int>::operator=(ppVar8,ppVar3);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator--(&local_110);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator--(&local_f8);
      }
      else {
        ppVar3 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&local_e8);
        ppVar8 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&local_110);
        std::pair<int,_int>::operator=(ppVar8,ppVar3);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator--(&local_110);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator--(&local_e8);
      }
    }
  }
  __first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       local_a0);
  __last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_a0
                     );
  std::
  copy<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )__last._M_current,end_local);
  mxx::datatype::~datatype((datatype *)&l);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_a0);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_70);
  return;
}

Assistant:

void bitonic_split(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm, int partner, int dir) {
    typedef typename std::iterator_traits<_Iterator>::value_type T;
    size_t np = std::distance(begin, end);
    //std::cout << "[Rank " << comm.rank() << "]: split with partner= " << partner << ", dir=" << dir << std::endl;
    std::vector<T> recv_buf(np);
    std::vector<T> merge_buf(np);

    // send/recv
    mxx::datatype dt = mxx::get_datatype<T>();
    MPI_Sendrecv(&*begin, np, dt.type(), partner, 0,
                 &recv_buf[0], np, dt.type(), partner, 0, comm, MPI_STATUS_IGNORE);

    // merge in `dir` direction into merge buffer
    if ((dir == asc && partner > comm.rank()) || (dir == desc && partner < comm.rank())) {
        // forward merge and keep the `np` smaller elements
        _Iterator l = begin;
        typename std::vector<T>::iterator r = recv_buf.begin();
        typename std::vector<T>::iterator o = merge_buf.begin();

        for (size_t i = 0; i < np; ++i) {
            if (comp(*l, *r)) {
                *o = *l;
                ++o;
                ++l;
            } else {
                *o = *r;
                ++o;
                ++r;
            }
        }
    } else {
        // backward merge and keep the `np` larger elements
        _Iterator l = begin+np-1;
        typename std::vector<T>::iterator r = recv_buf.begin()+np-1;
        typename std::vector<T>::iterator o = merge_buf.begin()+np-1;

        for (size_t i = 0; i < np; ++i) {
            if (comp(*l, *r)) {
                *o = *r;
                --o;
                --r;
            } else {
                *o = *l;
                --o;
                --l;
            }
        }
    }
    // copy results into local buffer
    std::copy(merge_buf.begin(), merge_buf.end(), begin);
}